

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::passHessian(Highs *this,HighsHessian *hessian_)

{
  bool bVar1;
  HighsStatus from_return_status;
  HighsStatus HVar2;
  HighsInt HVar3;
  HighsInt HVar4;
  reference pvVar5;
  undefined8 in_RSI;
  HighsHessian *in_RDI;
  __type_conflict _Var6;
  HighsInt iEl;
  double cost_scale_value;
  HighsHessian *hessian;
  HighsStatus return_status;
  HighsOptions *in_stack_00000250;
  HighsHessian *in_stack_00000258;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  Highs *in_stack_fffffffffffffe60;
  allocator *paVar7;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  undefined8 in_stack_fffffffffffffe70;
  HighsInt full_dim;
  __type_conflict _Var8;
  HighsStatus HVar9;
  string *message;
  HighsStatus in_stack_fffffffffffffeac;
  Highs *in_stack_fffffffffffffeb0;
  int local_cc;
  allocator local_b9;
  string local_b8 [144];
  vector<int,_std::allocator<int>_> *local_28;
  HighsStatus local_1c;
  HighsStatus local_4;
  
  full_dim = (HighsInt)((ulong)in_stack_fffffffffffffe70 >> 0x20);
  HVar4 = (HighsInt)((ulong)in_RSI >> 0x20);
  logHeader(in_stack_fffffffffffffe60);
  local_1c = 0;
  local_28 = &in_RDI[0xf].index_;
  HighsHessian::operator=
            ((HighsHessian *)in_stack_fffffffffffffe60,
             (HighsHessian *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  message = (string *)&in_RDI[0x22].start_;
  HighsLogOptions::HighsLogOptions
            ((HighsLogOptions *)in_stack_fffffffffffffe60,
             (HighsLogOptions *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  from_return_status = assessHessian(in_stack_00000258,in_stack_00000250);
  paVar7 = &local_b9;
  HVar9 = local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"assessHessian",paVar7);
  HVar2 = interpretCallStatus((HighsLogOptions *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac
                              ,from_return_status,message);
  local_1c = HVar2;
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x4862ea);
  if (local_1c == kError) {
    local_4 = local_1c;
  }
  else {
    if ((*(int *)&(local_28->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start != 0) &&
       (HVar3 = HighsHessian::numNz((HighsHessian *)0x48638d), HVar3 == 0)) {
      highsLogUser((HighsLogOptions *)
                   &in_RDI[0x2d].start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,kInfo,
                   "Hessian has dimension %d but no nonzeros, so is ignored\n",
                   (ulong)*(uint *)&(local_28->super__Vector_base<int,_std::allocator<int>_>).
                                    _M_impl.super__Vector_impl_data._M_start);
      HighsHessian::clear((HighsHessian *)in_stack_fffffffffffffe60);
    }
    if (*(int *)&(local_28->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start != 0) {
      completeHessian(full_dim,(HighsHessian *)
                               CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    }
    if (*(int *)((long)&in_RDI[10].start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 4) != 0) {
      bVar1 = HighsHessian::scaleOk(in_RDI,HVar4,(double)paVar7,(double)CONCAT44(HVar9,HVar2));
      if (!bVar1) {
        highsLogUser((HighsLogOptions *)
                     &in_RDI[0x2d].start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,kError,
                     "User cost scaling yields zeroed or excessive Hessian values\n");
        return kError;
      }
      _Var6 = std::pow<int,int>(0,0x48647f);
      for (local_cc = 0; HVar4 = HighsHessian::numNz((HighsHessian *)0x4864ab), local_cc < HVar4;
          local_cc = local_cc + 1) {
        _Var8 = _Var6;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)((long)(local_28 + 2) + 8),
                            (long)local_cc);
        *pvVar5 = _Var8 * *pvVar5;
      }
    }
    HighsLogOptions::HighsLogOptions
              ((HighsLogOptions *)in_stack_fffffffffffffe60,
               (HighsLogOptions *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    clearSolver(in_stack_fffffffffffffe60);
    paVar7 = (allocator *)&stack0xfffffffffffffeaf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xfffffffffffffeb0,"clearSolver",paVar7);
    local_1c = interpretCallStatus((HighsLogOptions *)in_stack_fffffffffffffeb0,
                                   in_stack_fffffffffffffeac,from_return_status,message);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeaf);
    HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x48659c);
    local_4 = returnFromHighs(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
  }
  return local_4;
}

Assistant:

HighsStatus Highs::passHessian(HighsHessian hessian_) {
  this->logHeader();
  HighsStatus return_status = HighsStatus::kOk;
  HighsHessian& hessian = model_.hessian_;
  hessian = std::move(hessian_);
  // Check validity of any Hessian, normalising its entries
  return_status = interpretCallStatus(options_.log_options,
                                      assessHessian(hessian, options_),
                                      return_status, "assessHessian");
  if (return_status == HighsStatus::kError) return return_status;
  if (hessian.dim_) {
    // Clear any zero Hessian
    if (hessian.numNz() == 0) {
      highsLogUser(options_.log_options, HighsLogType::kInfo,
                   "Hessian has dimension %" HIGHSINT_FORMAT
                   " but no nonzeros, so is ignored\n",
                   hessian.dim_);
      hessian.clear();
    }
  }
  // Ensure that any non-zero Hessian of dimension less than the
  // number of columns in the model is completed
  if (hessian.dim_) completeHessian(this->model_.lp_.num_col_, hessian);

  if (this->model_.lp_.user_cost_scale_) {
    // Assess and apply any user cost scaling
    if (!hessian.scaleOk(this->model_.lp_.user_cost_scale_,
                         this->options_.small_matrix_value,
                         this->options_.large_matrix_value)) {
      highsLogUser(
          options_.log_options, HighsLogType::kError,
          "User cost scaling yields zeroed or excessive Hessian values\n");
      return HighsStatus::kError;
    }
    double cost_scale_value = std::pow(2, this->model_.lp_.user_cost_scale_);
    for (HighsInt iEl = 0; iEl < hessian.numNz(); iEl++)
      hessian.value_[iEl] *= cost_scale_value;
  }
  return_status = interpretCallStatus(options_.log_options, clearSolver(),
                                      return_status, "clearSolver");
  return returnFromHighs(return_status);
}